

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaNf.c
# Opt level: O0

int Nf_CutRequired(Nf_Man_t *p,Nf_Mat_t *pM,int *pCutSet)

{
  int iVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  Mio_Cell2_t *pMVar5;
  int *pCut_00;
  int *piVar6;
  Nf_Obj_t *pNVar7;
  int local_4c;
  int local_48;
  int Required;
  int Arrival;
  int Req;
  int Arr;
  int fCompl;
  int iVar;
  int i;
  int *pCut;
  Mio_Cell2_t *pCell;
  int *pCutSet_local;
  Nf_Mat_t *pM_local;
  Nf_Man_t *p_local;
  
  pMVar5 = Nf_ManCell(p,*(uint *)pM & 0xfffff);
  pCut_00 = Nf_CutFromHandle(pCutSet,*(uint *)pM >> 0x14 & 0x3ff);
  local_48 = 0;
  local_4c = 0;
  fCompl = 0;
  while( true ) {
    iVar3 = Nf_CutSize(pCut_00);
    bVar2 = false;
    if (fCompl < iVar3) {
      piVar6 = Nf_CutLeaves(pCut_00);
      iVar3 = Nf_CfgVar(pM->Cfg,fCompl);
      Arr = piVar6[iVar3];
      bVar2 = false;
      if (Arr != 0) {
        Req = Nf_CfgCompl(pM->Cfg,fCompl);
        bVar2 = true;
      }
    }
    if (!bVar2) break;
    pNVar7 = Nf_ManObj(p,Arr);
    iVar3 = pNVar7->M[Req][0].D;
    iVar1 = pMVar5->iDelays[fCompl];
    iVar4 = Nf_ObjRequired(p,Arr,Req);
    local_48 = Abc_MaxInt(local_48,iVar3 + iVar1);
    if (iVar4 < 0x3fffffff) {
      local_4c = Abc_MaxInt(local_4c,iVar4 + pMVar5->iDelays[fCompl]);
    }
    fCompl = fCompl + 1;
  }
  iVar3 = Abc_MaxInt(local_4c + p->pPars->nReqTimeFlex * p->InvDelayI,local_48);
  return iVar3;
}

Assistant:

static inline int Nf_CutRequired( Nf_Man_t * p, Nf_Mat_t * pM, int * pCutSet )
{
    Mio_Cell2_t * pCell = Nf_ManCell( p, pM->Gate );
    int * pCut = Nf_CutFromHandle( pCutSet, pM->CutH );
    int i, iVar, fCompl;
    int Arr, Req, Arrival = 0, Required = 0;
    Nf_CutForEachVarCompl( pCut, pM->Cfg, iVar, fCompl, i )
    {
        Arr     = Nf_ManObj(p, iVar)->M[fCompl][0].D + pCell->iDelays[i];
        Req     = Nf_ObjRequired(p, iVar, fCompl);
        Arrival = Abc_MaxInt( Arrival, Arr );
        if ( Req < SCL_INFINITY )
            Required = Abc_MaxInt( Required, Req + pCell->iDelays[i] );
    }
    return Abc_MaxInt( Required + p->pPars->nReqTimeFlex*p->InvDelayI, Arrival ); 
}